

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O2

void sc_core::sc_report_handler::cache_report(sc_report *rep)

{
  sc_process_b *psVar1;
  sc_report *psVar2;
  
  psVar1 = sc_get_current_process_b();
  if (psVar1 == (sc_process_b *)0x0) {
    if (last_global_report != (sc_report *)0x0) {
      (**(code **)(*(long *)last_global_report + 8))();
    }
    psVar2 = (sc_report *)operator_new(0x50);
    sc_report::sc_report(psVar2,rep);
    last_global_report = psVar2;
  }
  else {
    psVar2 = (sc_report *)operator_new(0x50);
    sc_report::sc_report(psVar2,rep);
    if (psVar1->m_last_report_p != (sc_report *)0x0) {
      (**(code **)(*(long *)psVar1->m_last_report_p + 8))();
    }
    psVar1->m_last_report_p = psVar2;
  }
  return;
}

Assistant:

void sc_report_handler::cache_report(const sc_report& rep)
{
    sc_process_b * proc = sc_get_current_process_b();
    if ( proc )
	proc->set_last_report(new sc_report(rep));
    else
    {
	delete last_global_report;
	last_global_report = new sc_report(rep);
    }
}